

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O1

void __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Clear
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this)

{
  ChunkHeader *__ptr;
  ChunkHeader *pCVar1;
  
  if (this->shared_->refcount == 0) {
    __assert_fail("shared_->refcount > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/allocators.h"
                  ,0x116,
                  "void rapidjson::MemoryPoolAllocator<>::Clear() [BaseAllocator = rapidjson::CrtAllocator]"
                 );
  }
  while( true ) {
    __ptr = this->shared_->chunkHead;
    pCVar1 = __ptr->next;
    if (pCVar1 == (ChunkHeader *)0x0) break;
    this->shared_->chunkHead = pCVar1;
    free(__ptr);
  }
  this->shared_->chunkHead->size = 0;
  return;
}

Assistant:

void Clear() RAPIDJSON_NOEXCEPT {
        RAPIDJSON_NOEXCEPT_ASSERT(shared_->refcount > 0);
        for (;;) {
            ChunkHeader* c = shared_->chunkHead;
            if (!c->next) {
                break;
            }
            shared_->chunkHead = c->next;
            baseAllocator_->Free(c);
        }
        shared_->chunkHead->size = 0;
    }